

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# netrc.c
# Opt level: O3

char * Curl_netrc_strerror(NETRCcode ret)

{
  if (ret - NETRC_NO_MATCH < 4) {
    return &DAT_0017dc48 + *(int *)(&DAT_0017dc48 + (ulong)(ret - NETRC_NO_MATCH) * 4);
  }
  return "";
}

Assistant:

const char *Curl_netrc_strerror(NETRCcode ret)
{
  switch(ret) {
  default:
    return ""; /* not a legit error */
  case NETRC_FILE_MISSING:
    return "no such file";
  case NETRC_NO_MATCH:
    return "no matching entry";
  case NETRC_OUT_OF_MEMORY:
    return "out of memory";
  case NETRC_SYNTAX_ERROR:
    return "syntax error";
  }
  /* never reached */
}